

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_typeinfo(lua_State *L)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  GCstr *pGVar8;
  TValue *pTVar9;
  long lVar10;
  GCtab *t;
  
  plVar2 = *(long **)((L->glref).ptr64 + 0x180);
  plVar2[2] = (long)L;
  uVar6 = ffi_checkint(L,1);
  iVar7 = 0;
  if ((uVar6 != 0) && (uVar6 < *(uint *)(plVar2 + 1))) {
    lVar3 = *plVar2;
    lVar10 = (ulong)uVar6 * 0x18;
    lVar1 = lVar3 + lVar10;
    lua_createtable(L,0,4);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    pGVar8 = lj_str_new(L,"info",4);
    pTVar9 = lj_tab_setstr(L,t,pGVar8);
    pTVar9->n = (double)*(int *)(lVar3 + lVar10);
    if (*(int *)(lVar3 + 4 + lVar10) != -1) {
      pGVar8 = lj_str_new(L,"size",4);
      pTVar9 = lj_tab_setstr(L,t,pGVar8);
      pTVar9->n = (double)*(int *)(lVar1 + 4);
    }
    if (*(short *)(lVar1 + 8) != 0) {
      pGVar8 = lj_str_new(L,"sib",3);
      pTVar9 = lj_tab_setstr(L,t,pGVar8);
      pTVar9->n = (double)*(ushort *)(lVar1 + 8);
    }
    uVar4 = *(ulong *)(lVar1 + 0x10);
    if (uVar4 != 0) {
      if ((~*(byte *)((L->glref).ptr64 + 0x20) & *(byte *)(uVar4 + 8) & 3) != 0) {
        *(byte *)(uVar4 + 8) = *(byte *)(uVar4 + 8) ^ 3;
      }
      pGVar8 = lj_str_new(L,"name",4);
      pTVar9 = lj_tab_setstr(L,t,pGVar8);
      pTVar9->u64 = uVar4 | 0xfffd800000000000;
    }
    uVar5 = (L->glref).ptr64;
    iVar7 = 1;
    if (*(ulong *)(uVar5 + 0x18) <= *(ulong *)(uVar5 + 0x10)) {
      lj_gc_step(L);
    }
  }
  return iVar7;
}

Assistant:

LJLIB_CF(ffi_typeinfo)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = (CTypeID)ffi_checkint(L, 1);
  if (id > 0 && id < cts->top) {
    CType *ct = ctype_get(cts, id);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "info")), (int32_t)ct->info);
    if (ct->size != CTSIZE_INVALID)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "size")), (int32_t)ct->size);
    if (ct->sib)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "sib")), (int32_t)ct->sib);
    if (gcref(ct->name)) {
      GCstr *s = gco2str(gcref(ct->name));
      if (isdead(G(L), obj2gco(s))) flipwhite(obj2gco(s));
      setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "name")), s);
    }
    lj_gc_check(L);
    return 1;
  }
  return 0;
}